

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O3

void * clSharedMemAllocINTEL_EMU
                 (cl_context context,cl_device_id device,cl_mem_properties_intel *properties,
                 size_t size,cl_uint alignment,cl_int *errcode_ret)

{
  void *pvVar1;
  
  if ((g_pIntercept != (CLIntercept *)0x0) &&
     ((g_pIntercept->m_Config).Emulate_cl_intel_unified_shared_memory == true)) {
    pvVar1 = CLIntercept::emulatedSharedMemAlloc
                       (g_pIntercept,context,device,properties,size,alignment,errcode_ret);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void* CL_API_CALL clSharedMemAllocINTEL_EMU(
    cl_context context,
    cl_device_id device,
    const cl_mem_properties_intel* properties,
    size_t size,
    cl_uint alignment,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory )
    {
        return pIntercept->emulatedSharedMemAlloc(
            context,
            device,
            properties,
            size,
            alignment,
            errcode_ret );
    }

    return NULL;
}